

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

_Bool unshield_file_save_old(Unshield *unshield,int index,char *filename)

{
  undefined8 uVar1;
  _Bool _Var2;
  uint uVar3;
  uint8_t *buffer;
  void *buffer_00;
  FileDescriptor *file_descriptor;
  uint64_t uVar4;
  size_t sVar5;
  uint8_t *puVar6;
  uint8_t *buffer_01;
  char *pcVar7;
  void *pvVar8;
  int iVar9;
  uint8_t *extraout_RDX;
  uint8_t *pattern;
  uint8_t *extraout_RDX_00;
  void *__size;
  void *size;
  size_t size_00;
  long lVar10;
  undefined1 auVar11 [16];
  UnshieldReader *local_100;
  uint local_f8;
  void *local_e8;
  uint64_t local_d8;
  undefined8 local_c8;
  uint8_t *local_a0;
  uint local_98;
  undefined8 local_90;
  void *local_88;
  undefined4 local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  
  buffer = (uint8_t *)malloc(0x10000);
  buffer_00 = malloc(0x10000);
  if (unshield == (Unshield *)0x0) goto LAB_00103c2e;
  file_descriptor = unshield_get_file_descriptor((Unshield *)unshield->header_list,index);
  if (file_descriptor == (FileDescriptor *)0x0) {
    pcVar7 = "Failed to get file descriptor for file %i";
    iVar9 = 0x441;
    goto LAB_00103c24;
  }
  if (((file_descriptor->flags & 8) == 0) && (file_descriptor->data_offset != 0)) {
    if ((file_descriptor->link_flags & 1) == 0) {
      local_100 = unshield_reader_create(unshield,index,file_descriptor);
      if (local_100 != (UnshieldReader *)0x0) {
        uVar4 = unshield_fsize(unshield,local_100->volume_file);
        if (uVar4 == file_descriptor->data_offset) {
          _unshield_log(1,"unshield_file_save_old",0x45a,
                        "File %i is not inside the cabinet. Trying external file!",
                        (ulong)(uint)index);
          unshield_reader_destroy(local_100);
          local_100 = unshield_reader_create_external(unshield,index,file_descriptor);
          if (local_100 == (UnshieldReader *)0x0) {
            pcVar7 = "Failed to create data reader for file %i";
            iVar9 = 0x45f;
            goto LAB_00103c24;
          }
        }
        if (filename == (char *)0x0) {
          local_e8 = (void *)0x0;
        }
        else {
          local_e8 = (*unshield->io_callbacks->fopen)(filename,"wb",unshield->io_userdata);
          if (local_e8 == (void *)0x0) {
            _Var2 = false;
            _unshield_log(1,"unshield_file_save_old",0x469,"Failed to open output file \'%s\'",
                          filename);
            goto LAB_00103c30;
          }
        }
        local_f8 = (uint)file_descriptor->expanded_size;
        if (local_f8 == 0) {
          local_d8 = 0;
        }
        else {
          __size = (void *)0x10000;
          local_d8 = 0;
          do {
            if ((local_100->volume_bytes_left == 0) &&
               (_Var2 = unshield_reader_open_volume(local_100,local_100->volume + 1), !_Var2)) {
              _Var2 = false;
              _unshield_log(1,"unshield_file_save_old",0x47c,
                            "Failed to open volume %i to read %i more bytes",
                            (ulong)(local_100->volume + 1));
              goto LAB_00104120;
            }
            if ((file_descriptor->flags & 4) == 0) {
              size_00 = 0x10000;
              if (local_f8 < 0x10000) {
                size_00 = (size_t)local_f8;
              }
              _Var2 = unshield_reader_read(local_100,buffer_00,size_00);
              if (!_Var2) {
                _Var2 = false;
                _unshield_log(1,"unshield_file_save_old",0x4f2,
                              "Failed to read %i bytes from input cabinet file %i",size_00,
                              (ulong)file_descriptor->volume);
                goto LAB_00104120;
              }
              if ((local_e8 != (void *)0x0) &&
                 (sVar5 = (*unshield->io_callbacks->fwrite)
                                    (buffer_00,1,size_00,local_e8,unshield->io_userdata),
                 sVar5 != size_00)) {
                iVar9 = 0x4fc;
LAB_0010428a:
                _unshield_log(1,"unshield_file_save_old",iVar9,
                              "Failed to write %i bytes to file \'%s\'",size_00,filename);
                unshield_reader_destroy(local_100);
                _Var2 = false;
                goto LAB_00104136;
              }
              local_f8 = local_f8 - (int)size_00;
              local_d8 = local_d8 + size_00;
            }
            else {
              size = (void *)(ulong)local_100->volume_bytes_left;
              while (__size < size) {
                __size = (void *)((long)__size * 2);
                _unshield_log(3,"unshield_file_save_old",0x48a,"increased input_buffer_size to 0x%x"
                              ,__size);
                buffer = (uint8_t *)realloc(buffer,(size_t)__size);
                if (buffer == (uint8_t *)0x0) {
                  __assert_fail("input_buffer",
                                "/workspace/llm4binary/github/license_c_cmakelists/twogood[P]unshield/lib/file.c"
                                ,0x48e,"_Bool unshield_file_save_old(Unshield *, int, const char *)"
                               );
                }
              }
              pvVar8 = size;
              _Var2 = unshield_reader_read(local_100,buffer,(size_t)size);
              if (!_Var2) {
                pcVar7 = unshield_file_name(unshield,index);
                _unshield_log(1,"unshield_file_save_old",0x495,
                              "Failed to read 0x%x bytes of file %i (%s) from input cabinet file %i"
                              ,size,(ulong)(uint)index,pcVar7,(ulong)file_descriptor->volume);
LAB_00104204:
                _Var2 = false;
                goto LAB_00104120;
              }
              buffer_01 = buffer;
              puVar6 = extraout_RDX;
              if (size != (void *)0x0) {
                do {
                  puVar6 = find_bytes(buffer_01,(size_t)size,puVar6,(size_t)pvVar8);
                  if (puVar6 == (uint8_t *)0x0) {
                    pcVar7 = unshield_file_name(unshield,index);
                    _unshield_log(1,"unshield_file_save_old",0x4a1,
                                  "Could not find end of chunk for file %i (%s) from input cabinet file %i"
                                  ,(ulong)(uint)index,pcVar7,(ulong)file_descriptor->volume);
                    goto LAB_00104204;
                  }
                  while( true ) {
                    lVar10 = (long)puVar6 - (long)buffer_01;
                    pvVar8 = (void *)(lVar10 + 4);
                    if ((size < pvVar8 || (long)size - (long)pvVar8 == 0) ||
                       ((buffer_01[(long)pvVar8] & 1) == 0)) break;
                    pcVar7 = "It seems like we have an end of chunk marker inside of a chunk.";
                    _unshield_log(2,"unshield_file_save_old",0x4b6,
                                  "It seems like we have an end of chunk marker inside of a chunk.")
                    ;
                    puVar6 = find_bytes(buffer_01 + (long)pvVar8,(long)size - (long)pvVar8,pattern,
                                        (size_t)pcVar7);
                    if (puVar6 == (uint8_t *)0x0) {
                      pcVar7 = unshield_file_name(unshield,index);
                      _Var2 = false;
                      _unshield_log(1,"unshield_file_save_old",0x4bc,
                                    "Could not find end of chunk for file %i (%s) from input cabinet file %i"
                                    ,(ulong)(uint)index,pcVar7,(ulong)file_descriptor->volume);
                      goto LAB_00104120;
                    }
                  }
                  _unshield_log(3,"unshield_file_save_old",0x4c3,"chunk_size = 0x%x",lVar10);
                  buffer_01[lVar10] = '\0';
                  local_98 = (uint)lVar10;
                  local_80 = 0x10000;
                  local_60 = 0;
                  uStack_58 = 0;
                  local_a0 = buffer_01;
                  local_88 = buffer_00;
                  uVar3 = inflateInit2_(&local_a0,0xfffffff1,"1.2.11",0x70);
                  if (uVar3 != 0) {
LAB_001040d0:
                    local_c8 = 0;
LAB_001040d9:
                    _Var2 = false;
                    _unshield_log(1,"unshield_file_save_old",0x4d0,
                                  "Decompression failed with code %i. input_size=%i, volume_bytes_left=%i, volume=%i, read_bytes=%i"
                                  ,(ulong)uVar3,size,(ulong)local_100->volume_bytes_left,
                                  (ulong)file_descriptor->volume,local_c8);
                    goto LAB_00104120;
                  }
                  while (size_00 = local_78, uVar1 = local_90, 1 < local_98) {
                    uVar3 = inflate(&local_a0,5);
                    if (uVar3 != 0) {
                      inflateEnd(&local_a0);
                      goto LAB_001040d0;
                    }
                  }
                  local_c8 = local_90;
                  uVar3 = inflateEnd(&local_a0);
                  if (uVar3 != 0) goto LAB_001040d9;
                  _unshield_log(3,"unshield_file_save_old",0x4d5,"read_bytes = 0x%x",uVar1);
                  pvVar8 = local_e8;
                  puVar6 = extraout_RDX_00;
                  if (local_e8 != (void *)0x0) {
                    auVar11 = (undefined1  [16])
                              (*unshield->io_callbacks->fwrite)
                                        (buffer_00,1,size_00,local_e8,unshield->io_userdata);
                    puVar6 = auVar11._8_8_;
                    if (size_00 != auVar11._0_8_) {
                      iVar9 = 0x4e2;
                      goto LAB_0010428a;
                    }
                  }
                  size = (void *)((long)size + (-4 - lVar10));
                  local_f8 = local_f8 - (int)size_00;
                  local_d8 = local_d8 + size_00;
                } while ((size != (void *)0x0) &&
                        (buffer_01 = buffer_01 + lVar10 + 4, local_f8 != 0));
              }
            }
          } while (local_f8 != 0);
        }
        _Var2 = true;
        if (file_descriptor->expanded_size != local_d8) {
          _Var2 = false;
          _unshield_log(1,"unshield_file_save_old",0x509,
                        "Expanded size expected to be %i, but was %i");
        }
LAB_00104120:
        unshield_reader_destroy(local_100);
        if (local_e8 != (void *)0x0) {
LAB_00104136:
          (*unshield->io_callbacks->fclose)(local_e8,unshield->io_userdata);
        }
        goto LAB_00103c38;
      }
      pcVar7 = "Failed to create data reader for file %i";
      iVar9 = 0x454;
LAB_00103c24:
      _unshield_log(1,"unshield_file_save_old",iVar9,pcVar7,(ulong)(uint)index);
      goto LAB_00103c2e;
    }
    _Var2 = unshield_file_save_old(unshield,file_descriptor->link_previous,filename);
    local_100 = (UnshieldReader *)0x0;
  }
  else {
LAB_00103c2e:
    local_100 = (UnshieldReader *)0x0;
    _Var2 = false;
  }
LAB_00103c30:
  unshield_reader_destroy(local_100);
LAB_00103c38:
  if (buffer != (uint8_t *)0x0) {
    free(buffer);
  }
  if (buffer_00 != (void *)0x0) {
    free(buffer_00);
  }
  return _Var2;
}

Assistant:

bool unshield_file_save_old(Unshield* unshield, int index, const char* filename)/*{{{*/
{
  /* XXX: Thou Shalt Not Cut & Paste... */
  bool success = false;
  FILE* output = NULL;
  size_t input_buffer_size = BUFFER_SIZE;
  unsigned char* input_buffer   = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned char* output_buffer  = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned int bytes_left;
  uLong total_written = 0;
  UnshieldReader* reader = NULL;
  FileDescriptor* file_descriptor;

  if (!unshield)
    goto exit;

  if (!(file_descriptor = unshield_get_file_descriptor(unshield, index)))
  {
    unshield_error("Failed to get file descriptor for file %i", index);
    goto exit;
  }

  if ((file_descriptor->flags & FILE_INVALID) || 0 == file_descriptor->data_offset)
  {
    /* invalid file */
    goto exit;
  }

  if (file_descriptor->link_flags & LINK_PREV)
  {
    success = unshield_file_save_old(unshield, file_descriptor->link_previous, filename);
    goto exit;
  }

  reader = unshield_reader_create(unshield, index, file_descriptor);
  if (!reader)
  {
    unshield_error("Failed to create data reader for file %i", index);
    goto exit;
  }

  if (unshield_fsize(unshield, reader->volume_file) == (long)file_descriptor->data_offset)
  {
      unshield_error("File %i is not inside the cabinet. Trying external file!", index);
      unshield_reader_destroy(reader);
      reader = unshield_reader_create_external(unshield, index, file_descriptor);
      if (!reader)
      {
          unshield_error("Failed to create data reader for file %i", index);
          goto exit;
      }
  }

  if (filename) 
  {
    output = unshield_fopen(unshield, filename, "wb");
    if (!output)
    {
      unshield_error("Failed to open output file '%s'", filename);
      goto exit;
    }
  }

    bytes_left = file_descriptor->expanded_size;

#if VERBOSE >= 4
  unshield_trace("Bytes to write: %i", bytes_left);
#endif

  while (bytes_left > 0)
  {
    uLong bytes_to_write = 0;
    int result;

    if (reader->volume_bytes_left == 0 && !unshield_reader_open_volume(reader, reader->volume + 1))
    {
      unshield_error("Failed to open volume %i to read %i more bytes",
                     reader->volume + 1, bytes_left);
      goto exit;
    }

    if (file_descriptor->flags & FILE_COMPRESSED)
    {
      uLong read_bytes;
      size_t input_size = reader->volume_bytes_left;
      uint8_t* chunk_buffer;

      while (input_size > input_buffer_size) 
      {
        input_buffer_size *= 2;
#if VERBOSE >= 3
        unshield_trace("increased input_buffer_size to 0x%x", input_buffer_size);
#endif

        input_buffer = realloc(input_buffer, input_buffer_size);
        assert(input_buffer);
      }

      if (!unshield_reader_read(reader, input_buffer, input_size))
      {
#if VERBOSE
        unshield_error("Failed to read 0x%x bytes of file %i (%s) from input cabinet file %i", 
            input_size, index, unshield_file_name(unshield, index), file_descriptor->volume);
#endif
        goto exit;
      }

      for (chunk_buffer = input_buffer; input_size && bytes_left; )
      {
        size_t chunk_size;
        uint8_t* match = find_bytes(chunk_buffer, input_size, END_OF_CHUNK, sizeof(END_OF_CHUNK));
        if (!match)
        {
          unshield_error("Could not find end of chunk for file %i (%s) from input cabinet file %i",
              index, unshield_file_name(unshield, index), file_descriptor->volume);
          goto exit;
        }

        chunk_size = match - chunk_buffer;

        /*
           Detect when the chunk actually contains the end of chunk marker.

           Needed by Qtime.smk from "The Feeble Files - spanish version".

           The first bit of a compressed block is always zero, so we apply this
           workaround if it's a one.

           A possibly more proper fix for this would be to have
           unshield_uncompress_old eat compressed data and discard chunk
           markers inbetween.
           */
        while ((chunk_size + sizeof(END_OF_CHUNK)) < input_size &&
            chunk_buffer[chunk_size + sizeof(END_OF_CHUNK)] & 1)
        {
          unshield_warning("It seems like we have an end of chunk marker inside of a chunk.");
          chunk_size += sizeof(END_OF_CHUNK);
          match = find_bytes(chunk_buffer + chunk_size, input_size - chunk_size, END_OF_CHUNK, sizeof(END_OF_CHUNK));
          if (!match)
          {
            unshield_error("Could not find end of chunk for file %i (%s) from input cabinet file %i",
                index, unshield_file_name(unshield, index), file_descriptor->volume);
            goto exit;
          }
          chunk_size = match - chunk_buffer;
        }

#if VERBOSE >= 3
        unshield_trace("chunk_size = 0x%x", chunk_size);
#endif

        /* add a null byte to make inflate happy */
        chunk_buffer[chunk_size] = 0;

        bytes_to_write = BUFFER_SIZE;
        read_bytes = chunk_size;
        result = unshield_uncompress_old(output_buffer, &bytes_to_write, chunk_buffer, &read_bytes);

        if (Z_OK != result)
        {
          unshield_error("Decompression failed with code %i. input_size=%i, volume_bytes_left=%i, volume=%i, read_bytes=%i",
              result, input_size, reader->volume_bytes_left, file_descriptor->volume, read_bytes);
          goto exit;
        }

#if VERBOSE >= 3
        unshield_trace("read_bytes = 0x%x", read_bytes);
#endif

        chunk_buffer += chunk_size;
        chunk_buffer += sizeof(END_OF_CHUNK);

        input_size -= chunk_size;
        input_size -= sizeof(END_OF_CHUNK);

          bytes_left -= bytes_to_write;

          if (output) {
              if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output)) {
                  unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
                  goto exit;
              }
          }

        total_written += bytes_to_write;
      }
    }
    else
    {
      bytes_to_write = MIN(bytes_left, BUFFER_SIZE);

      if (!unshield_reader_read(reader, output_buffer, bytes_to_write))
      {
#if VERBOSE
        unshield_error("Failed to read %i bytes from input cabinet file %i", 
            bytes_to_write, file_descriptor->volume);
#endif
        goto exit;
      }

      bytes_left -= bytes_to_write;

      if (output) {
        if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output))
        {
          unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
          goto exit;
        }
      }

      total_written += bytes_to_write;

    }
  }

  if (file_descriptor->expanded_size != total_written)
  {
    unshield_error("Expanded size expected to be %i, but was %i", 
        file_descriptor->expanded_size, total_written);
    goto exit;
  }

  success = true;
  
exit:
  unshield_reader_destroy(reader);
  FCLOSE(unshield, output);
  FREE(input_buffer);
  FREE(output_buffer);
  return success;
}